

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

FILE * cimg_library::cimg::output(FILE *file)

{
  if (Mutex_attr()::val == '\0') {
    output();
  }
  pthread_mutex_lock((pthread_mutex_t *)(Mutex_attr()::val + 0x28));
  if (output(_IO_FILE*)::res == '\0') {
    output();
  }
  if (file != (FILE *)0x0) {
    output::res = file;
  }
  if (Mutex_attr()::val == '\0') {
    output();
  }
  pthread_mutex_unlock((pthread_mutex_t *)(Mutex_attr()::val + 0x28));
  return output::res;
}

Assistant:

inline std::FILE* output(std::FILE *file) {
      cimg::mutex(1);
      static std::FILE *res = stderr;
      if (file) res = file;
      cimg::mutex(1,0);
      return res;
    }